

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall icu_63::double_conversion::Bignum::Square(Bignum *this)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  
  iVar6 = this->used_digits_;
  lVar3 = (long)iVar6;
  if (0x40 < lVar3) {
    abort();
  }
  puVar1 = (this->bigits_).start_;
  for (lVar8 = 0; lVar8 < iVar6; lVar8 = lVar8 + 1) {
    puVar1[lVar3 + lVar8] = puVar1[lVar8];
    iVar6 = this->used_digits_;
  }
  puVar1 = (this->bigits_).start_;
  lVar8 = lVar3 * 4;
  lVar9 = 1;
  lVar10 = 0;
  uVar4 = 0;
  while( true ) {
    lVar5 = (long)iVar6;
    puVar2 = (this->bigits_).start_;
    if (lVar5 <= lVar10) break;
    puVar7 = (uint *)((long)puVar2 + lVar8);
    for (lVar5 = 0; lVar9 != lVar5; lVar5 = lVar5 + 1) {
      uVar4 = uVar4 + (ulong)puVar2[lVar3 + lVar5] * (ulong)*puVar7;
      puVar7 = puVar7 + -1;
    }
    puVar1[lVar10] = (uint)uVar4 & 0xfffffff;
    uVar4 = uVar4 >> 0x1c;
    lVar10 = lVar10 + 1;
    lVar9 = lVar9 + 1;
    iVar6 = this->used_digits_;
    lVar8 = lVar8 + 4;
  }
  while (SBORROW8(lVar5,lVar3 * 2) != lVar5 + lVar3 * -2 < 0) {
    iVar6 = this->used_digits_;
    lVar8 = (long)(iVar6 + -1);
    puVar1 = (this->bigits_).start_;
    for (lVar9 = (long)((int)(lVar5 + 1) - iVar6); lVar9 < iVar6; lVar9 = lVar9 + 1) {
      uVar4 = uVar4 + (ulong)puVar1[lVar3 + lVar9] * (ulong)puVar1[lVar3 + lVar8];
      lVar8 = lVar8 + -1;
    }
    puVar2[lVar5] = (uint)uVar4 & 0xfffffff;
    uVar4 = uVar4 >> 0x1c;
    lVar5 = lVar5 + 1;
  }
  this->used_digits_ = (int)(lVar3 * 2);
  this->exponent_ = this->exponent_ << 1;
  Clamp(this);
  return;
}

Assistant:

void Bignum::Square() {
  ASSERT(IsClamped());
  int product_length = 2 * used_digits_;
  EnsureCapacity(product_length);

  // Comba multiplication: compute each column separately.
  // Example: r = a2a1a0 * b2b1b0.
  //    r =  1    * a0b0 +
  //        10    * (a1b0 + a0b1) +
  //        100   * (a2b0 + a1b1 + a0b2) +
  //        1000  * (a2b1 + a1b2) +
  //        10000 * a2b2
  //
  // In the worst case we have to accumulate nb-digits products of digit*digit.
  //
  // Assert that the additional number of bits in a DoubleChunk are enough to
  // sum up used_digits of Bigit*Bigit.
  if ((1 << (2 * (kChunkSize - kBigitSize))) <= used_digits_) {
    UNIMPLEMENTED();
  }
  DoubleChunk accumulator = 0;
  // First shift the digits so we don't overwrite them.
  int copy_offset = used_digits_;
  for (int i = 0; i < used_digits_; ++i) {
    bigits_[copy_offset + i] = bigits_[i];
  }
  // We have two loops to avoid some 'if's in the loop.
  for (int i = 0; i < used_digits_; ++i) {
    // Process temporary digit i with power i.
    // The sum of the two indices must be equal to i.
    int bigit_index1 = i;
    int bigit_index2 = 0;
    // Sum all of the sub-products.
    while (bigit_index1 >= 0) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  for (int i = used_digits_; i < product_length; ++i) {
    int bigit_index1 = used_digits_ - 1;
    int bigit_index2 = i - bigit_index1;
    // Invariant: sum of both indices is again equal to i.
    // Inner loop runs 0 times on last iteration, emptying accumulator.
    while (bigit_index2 < used_digits_) {
      Chunk chunk1 = bigits_[copy_offset + bigit_index1];
      Chunk chunk2 = bigits_[copy_offset + bigit_index2];
      accumulator += static_cast<DoubleChunk>(chunk1) * chunk2;
      bigit_index1--;
      bigit_index2++;
    }
    // The overwritten bigits_[i] will never be read in further loop iterations,
    // because bigit_index1 and bigit_index2 are always greater
    // than i - used_digits_.
    bigits_[i] = static_cast<Chunk>(accumulator) & kBigitMask;
    accumulator >>= kBigitSize;
  }
  // Since the result was guaranteed to lie inside the number the
  // accumulator must be 0 now.
  ASSERT(accumulator == 0);

  // Don't forget to update the used_digits and the exponent.
  used_digits_ = product_length;
  exponent_ *= 2;
  Clamp();
}